

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceFile.cpp
# Opt level: O0

void __thiscall hdc::SourceFile::SourceFile(SourceFile *this)

{
  SourceFile *this_local;
  
  ASTNode::ASTNode(&this->super_ASTNode);
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR_accept_00220a10;
  std::__cxx11::string::string((string *)&this->path);
  std::vector<hdc::Class_*,_std::allocator<hdc::Class_*>_>::vector(&this->classes);
  std::vector<hdc::Struct_*,_std::allocator<hdc::Struct_*>_>::vector(&this->structures);
  std::vector<hdc::Import_*,_std::allocator<hdc::Import_*>_>::vector(&this->imports);
  std::vector<hdc::Def_*,_std::allocator<hdc::Def_*>_>::vector(&this->defs);
  std::vector<hdc::GlobalVariable_*,_std::allocator<hdc::GlobalVariable_*>_>::vector
            (&this->globalVariables);
  std::vector<hdc::GlobalConstant_*,_std::allocator<hdc::GlobalConstant_*>_>::vector
            (&this->globalConstants);
  this->symbolTable = (SymbolTable *)0x0;
  ASTNode::setKind(&this->super_ASTNode,AST_SOURCE);
  return;
}

Assistant:

SourceFile::SourceFile() {
    this->symbolTable = nullptr;
    setKind(AST_SOURCE);
}